

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O2

void insert_to_bucket(hashtable_t *hashtable,bucket_t *bucket,list_t *list)

{
  hashtable_list *phVar1;
  hashtable_list *phVar2;
  hashtable_list *phVar3;
  
  phVar2 = bucket->first;
  phVar3 = &hashtable->list;
  if ((phVar2 == phVar3) && (phVar2 == bucket->last)) {
    phVar2 = (hashtable_list *)&bucket->last;
    list->next = phVar3;
    phVar1 = phVar3->prev;
    list->prev = phVar1;
    phVar1->next = list;
  }
  else {
    list->next = phVar2;
    phVar3 = phVar2->prev;
    list->prev = phVar3;
    phVar3 = (hashtable_list *)&phVar3->next;
  }
  phVar3->prev = list;
  phVar2->prev = list;
  bucket->first = list;
  return;
}

Assistant:

static void insert_to_bucket(hashtable_t *hashtable, bucket_t *bucket, list_t *list) {
    if (bucket_is_empty(hashtable, bucket)) {
        list_insert(&hashtable->list, list);
        bucket->first = bucket->last = list;
    } else {
        list_insert(bucket->first, list);
        bucket->first = list;
    }
}